

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O0

void test_disjoint(void)

{
  _Bool _Var1;
  bitset_t *b1;
  bitset_t *b2;
  int i;
  bitset_t *odds;
  bitset_t *evens;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  b1 = bitset_create();
  b2 = bitset_create();
  for (iVar2 = 0; iVar2 < 1000; iVar2 = iVar2 + 1) {
    if (iVar2 % 2 == 0) {
      bitset_set(b2,CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    }
    else {
      bitset_set(b2,CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    }
  }
  _Var1 = bitsets_disjoint(b1,b2);
  if (!_Var1) {
    fprintf(_stderr,"Assertion failed in %s at line %d\n","test_disjoint",0xad);
    exit(1);
  }
  bitset_set(b2,CONCAT44(iVar2,in_stack_ffffffffffffffe8));
  bitset_set(b2,CONCAT44(iVar2,in_stack_ffffffffffffffe8));
  _Var1 = bitsets_disjoint(b1,b2);
  if (!_Var1) {
    bitset_free((bitset_t *)0x101f8c);
    bitset_free((bitset_t *)0x101f96);
    return;
  }
  fprintf(_stderr,"Assertion failed in %s at line %d\n","test_disjoint",0xb2);
  exit(1);
}

Assistant:

void test_disjoint() {
  bitset_t *evens = bitset_create();
  bitset_t *odds = bitset_create();

  for (int i = 0; i < 1000; i++) {
    if (i % 2 == 0)
      bitset_set(evens, i);
    else
      bitset_set(odds, i);
  }

  TEST_ASSERT(bitsets_disjoint(evens, odds));

  bitset_set(evens, 501);
  bitset_set(odds, 501);

  TEST_ASSERT(!bitsets_disjoint(evens, odds));

  bitset_free(evens);
  bitset_free(odds);
}